

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.cpp
# Opt level: O1

void __thiscall FactoredMMDPDiscrete::Initialize2DBN(FactoredMMDPDiscrete *this)

{
  EmptyObservationProbFunctor of;
  BoundTransitionProbFunctor<FactoredMMDPDiscrete> tf;
  BoundScopeFunctor<FactoredMMDPDiscrete> sf;
  ObservationProbFunctor local_58;
  TransitionProbFunctor local_48;
  FactoredMMDPDiscrete *local_40;
  undefined8 local_38;
  undefined8 local_30;
  ScopeFunctor local_28;
  FactoredMMDPDiscrete *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  ConstructObservations(this);
  MADPComponentDiscreteObservations::SetInitialized
            (&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_O,true);
  local_28._vptr_ScopeFunctor = (_func_int **)&PTR_operator___005e65d0;
  local_18 = 0x41;
  local_10 = 0;
  local_48._vptr_TransitionProbFunctor = (_func_int **)&PTR_operator___005e6600;
  local_38 = 0x49;
  local_30 = 0;
  local_58._m_isEmpty = true;
  local_58._vptr_ObservationProbFunctor = (_func_int **)&PTR_operator___005e6528;
  local_40 = this;
  local_20 = this;
  MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN
            ((MultiAgentDecisionProcessDiscreteFactoredStates *)this,&local_28,&local_48,&local_58);
  Initialize2DBNObservations(this);
  return;
}

Assistant:

void FactoredMMDPDiscrete::Initialize2DBN()
{
    // construct observations
    ConstructObservations();
    SetObservationsInitialized(true); // Note: joint indices are likely to break

    BoundScopeFunctor<FactoredMMDPDiscrete> sf(this,&FactoredMMDPDiscrete::SetScopes);
    BoundTransitionProbFunctor<FactoredMMDPDiscrete> tf(this,&FactoredMMDPDiscrete::ComputeTransitionProb);
    EmptyObservationProbFunctor of;
    
    MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN(sf, tf, of); 

    // above calls SetOScopes and initializes CPD vector for observation variables
    Initialize2DBNObservations(); // set actual CPDs
}